

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
::positive_negative_transpose
          (Chain_barcode_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
           *this,ID_index pivot1,ID_index pivot2)

{
  uint simplexIndex;
  uint simplexIndex_00;
  value_type vVar1;
  pointer puVar2;
  Pos_index *pPVar3;
  reference pvVar4;
  reference pvVar5;
  Dictionary *this_00;
  
  puVar2 = (this->pivotToPosition_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  simplexIndex = puVar2[pivot1];
  simplexIndex_00 = puVar2[pivot2];
  pPVar3 = _birth(this,simplexIndex);
  *pPVar3 = simplexIndex_00;
  pPVar3 = _death(this,simplexIndex_00);
  *pPVar3 = simplexIndex;
  this_00 = &(this->
             super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_true>_>_>
             ).indexToBar_;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,(ulong)simplexIndex)
  ;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     (this_00,(ulong)simplexIndex_00);
  vVar1 = *pvVar4;
  *pvVar4 = *pvVar5;
  *pvVar5 = vVar1;
  return;
}

Assistant:

void positive_negative_transpose(ID_index pivot1, ID_index pivot2) {
    Pos_index pos1 = _get_pivot_position(pivot1);
    Pos_index pos2 = _get_pivot_position(pivot2);

    _birth(pos1) = pos2;
    _death(pos2) = pos1;
    std::swap(CP::indexToBar_.at(pos1), CP::indexToBar_.at(pos2));
  }